

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::init<Kernel::TypedTermList>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  TypedTermList term;
  TermList in_RCX;
  long in_RDX;
  EVP_PKEY_CTX *in_RSI;
  anon_class_8_1_8991fb9c in_RDI;
  SortId in_R8;
  byte in_R9B;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *unaff_retaddr;
  byte in_stack_00000008;
  Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *in_stack_ffffffffffffff78;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *this_00;
  InstanceCntr local_55 [13];
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> local_48;
  byte local_2a;
  byte local_29;
  long local_28;
  EVP_PKEY_CTX *local_20;
  undefined1 backtrackable;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_28 = in_RDX;
  local_20 = in_RSI;
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::init
            (&(in_RDI.this)->_algo,in_RSI);
  (in_RDI.this)->_retrieveSubstitution = (bool)(local_29 & 1);
  local_48._nextVar = 0;
  local_48._4_4_ = 0;
  local_48._root = (Node *)0x0;
  this_00 = &local_48;
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)0x3c6ce7);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::operator=
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)in_RDI.this,
             in_stack_ffffffffffffff78);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::~Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)0x3c6d09);
  (in_RDI.this)->_normalizationRecording = false;
  InstanceCntr::InstanceCntr(local_55,(Cntr *)(local_20 + 0x10));
  if (local_28 != 0) {
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdRecord
              (&(in_RDI.this)->_algo,(BacktrackData *)in_stack_ffffffffffffff78);
    term._sort._content = in_R8._content;
    term.super_TermList._content = in_RCX._content;
    createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::init<Kernel::TypedTermList>(Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node*,Kernel::TypedTermList,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
              (this_00,term,SUB81((ulong)in_RDI.this >> 0x38,0),in_RDI);
    backtrackable = (undefined1)(in_RCX._content >> 0x38);
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdDone
              ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)0x3c6db0);
    prepareChildren(unaff_retaddr,(Node *)in_R8._content,(bool)backtrackable);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }